

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall
xray_re::se_smart_cover::state_read(se_smart_cover *this,xr_packet *packet,uint16_t size)

{
  pointer *pplVar1;
  byte bVar2;
  char *pcVar3;
  iterator __position;
  vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
  *pvVar4;
  string *value_00;
  uint uVar5;
  uchar value;
  loophole local_48;
  uint8_t *local_38;
  
  cse_smart_cover::state_read(&this->super_cse_smart_cover,packet,size);
  if (0x7f < (this->super_cse_smart_cover).super_cse_alife_dynamic_object.super_cse_alife_object.
             super_cse_abstract.m_version) {
    xr_packet::r_sz(packet,&this->m_last_description);
    local_38 = &this->m_loopholes_count;
    xr_packet::r_raw(packet,local_38,1);
    bVar2 = this->m_loopholes_count;
    if ((ulong)bVar2 != 0) {
      pvVar4 = (vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
                *)operator_new(0x18);
      (pvVar4->
      super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar4->
      super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar4->
      super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_loopholes = pvVar4;
      std::
      vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      ::reserve(pvVar4,(ulong)bVar2);
      if (this->m_loopholes_count != '\0') {
        uVar5 = 0;
        do {
          value_00 = (string *)operator_new(0x20);
          (value_00->_M_dataplus)._M_p = (pointer)&value_00->field_2;
          value_00->_M_string_length = 0;
          (value_00->field_2)._M_local_buf[0] = '\0';
          xr_packet::r_sz(packet,value_00);
          pvVar4 = this->m_loopholes;
          pcVar3 = (value_00->_M_dataplus)._M_p;
          xr_packet::r_raw(packet,&local_48,1);
          local_48.enabled = (char)local_48.id != '\0';
          __position._M_current =
               (pvVar4->
               super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_48.id = pcVar3;
          if (__position._M_current ==
              (pvVar4->
              super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
            ::_M_realloc_insert<xray_re::se_smart_cover::loophole>(pvVar4,__position,&local_48);
          }
          else {
            (__position._M_current)->id = pcVar3;
            *(ulong *)&(__position._M_current)->enabled = CONCAT71(local_48._9_7_,local_48.enabled);
            pplVar1 = &(pvVar4->
                       super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *pplVar1 = *pplVar1 + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < *local_38);
      }
    }
  }
  return;
}

Assistant:

void se_smart_cover::state_read(xr_packet& packet, uint16_t size)
{
	cse_smart_cover::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		packet.r_sz(m_last_description);
		packet.r_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			m_loopholes = new std::vector<loophole>();

			m_loopholes->reserve(m_loopholes_count);

			for (int i = 0; i < m_loopholes_count; ++i)
			{
				std::string *id = new std::string;
				packet.r_sz(*id);
				m_loopholes->push_back(loophole(id->c_str(), packet.r_bool()));
			}
		}
	}
}